

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void finish_pass_huff(j_compress_ptr cinfo)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  boolean bVar8;
  long *in_RDI;
  working_state state;
  huff_entropy_ptr entropy;
  working_state *in_stack_000001e8;
  
  lVar1 = in_RDI[0x3e];
  uVar2 = *(undefined8 *)in_RDI[5];
  uVar3 = *(undefined8 *)(in_RDI[5] + 8);
  uVar4 = *(undefined8 *)(lVar1 + 0x18);
  uVar5 = *(undefined8 *)(lVar1 + 0x20);
  uVar6 = *(undefined8 *)(lVar1 + 0x28);
  uVar7 = *(undefined8 *)(lVar1 + 0x30);
  bVar8 = flush_bits(in_stack_000001e8);
  if (bVar8 == 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x18;
    (**(code **)*in_RDI)(in_RDI);
  }
  *(undefined8 *)in_RDI[5] = uVar2;
  *(undefined8 *)(in_RDI[5] + 8) = uVar3;
  *(undefined8 *)(lVar1 + 0x18) = uVar4;
  *(undefined8 *)(lVar1 + 0x20) = uVar5;
  *(undefined8 *)(lVar1 + 0x28) = uVar6;
  *(undefined8 *)(lVar1 + 0x30) = uVar7;
  return;
}

Assistant:

METHODDEF(void)
finish_pass_huff(j_compress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  working_state state;

  /* Load up working state ... flush_bits needs it */
  state.next_output_byte = cinfo->dest->next_output_byte;
  state.free_in_buffer = cinfo->dest->free_in_buffer;
  state.cur = entropy->saved;
  state.cinfo = cinfo;
  state.simd = entropy->simd;

  /* Flush out the last data */
  if (!flush_bits(&state))
    ERREXIT(cinfo, JERR_CANT_SUSPEND);

  /* Update state */
  cinfo->dest->next_output_byte = state.next_output_byte;
  cinfo->dest->free_in_buffer = state.free_in_buffer;
  entropy->saved = state.cur;
}